

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
write_decimal<unsigned_int>
          (arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this,
          uint value)

{
  ulong uVar1;
  buffer<char> *pbVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  undefined1 *puVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  ulong __n;
  buffer<char> *c;
  undefined1 auStack_48 [32];
  
  uVar9 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar9 = (uVar9 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  __n = (ulong)((uVar9 - (value < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 +
                                           (ulong)uVar9 * 4))) + 1);
  pbVar2 = (this->out_).container;
  sVar3 = pbVar2->size_;
  uVar1 = sVar3 + __n;
  if (pbVar2->capacity_ < uVar1) {
    (**pbVar2->_vptr_buffer)(pbVar2,uVar1);
  }
  pbVar2->size_ = uVar1;
  puVar6 = auStack_48 + __n;
  uVar9 = value;
  if (99 < value) {
    do {
      value = uVar9 / 100;
      *(undefined2 *)(puVar6 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar9 % 100) * 2);
      puVar6 = puVar6 + -2;
      bVar5 = 9999 < uVar9;
      uVar9 = uVar9 / 100;
    } while (bVar5);
  }
  pcVar4 = pbVar2->ptr_;
  if (value < 10) {
    bVar8 = (byte)value | 0x30;
    lVar7 = -1;
  }
  else {
    puVar6[-1] = basic_data<void>::digits[((ulong)value * 2 & 0xffffffff) + 1];
    bVar8 = basic_data<void>::digits[(ulong)value * 2];
    lVar7 = -2;
  }
  puVar6[lVar7] = bVar8;
  if (__n != 0) {
    memcpy(pcVar4 + sVar3,auStack_48,__n);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }